

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

Float __thiscall pbrt::PiecewiseLinearSpectrum::MaxValue(PiecewiseLinearSpectrum *this)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  float *__result;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  float fVar6;
  undefined1 auVar7 [64];
  
  sVar1 = (this->values).nStored;
  if (sVar1 != 0) {
    pfVar3 = (this->values).ptr;
    if (sVar1 != 1) {
      auVar7 = ZEXT464((uint)*pfVar3);
      lVar4 = sVar1 * 4 + -4;
      pfVar5 = pfVar3;
      do {
        pfVar5 = pfVar5 + 1;
        fVar6 = auVar7._0_4_;
        auVar2 = vmaxss_avx(ZEXT416((uint)*pfVar5),auVar7._0_16_);
        auVar7 = ZEXT1664(auVar2);
        if (fVar6 < *pfVar5) {
          pfVar3 = pfVar5;
        }
        lVar4 = lVar4 + -4;
      } while (lVar4 != 0);
    }
    return *pfVar3;
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU
    bool empty() const { return size() == 0; }